

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

Dialog * __thiscall Quest_Context::GetDialog(Quest_Context *this,short id)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  short id_local;
  Quest_Context *this_local;
  
  it._M_node._6_2_ = id;
  bVar1 = Quest::Disabled(this->quest);
  if (bVar1) {
    this_local = (Quest_Context *)0x0;
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
         ::find(&this->dialogs,(key_type *)((long)&it._M_node + 6));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
         ::end(&this->dialogs);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      this_local = (Quest_Context *)0x0;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>::
               operator->(&local_28);
      this_local = (Quest_Context *)
                   std::__shared_ptr<Dialog,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(ppVar2->second).
                               super___shared_ptr<Dialog,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return (Dialog *)this_local;
}

Assistant:

const Dialog* Quest_Context::GetDialog(short id) const
{
	if (this->quest->Disabled())
		return 0;

	auto it = this->dialogs.find(id);

	if (it == this->dialogs.end())
		return 0;

	// WARNING: returns a non-tracked reference to shared_ptr
	return it->second.get();
}